

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cFramebufferNoAttachmentsTests.cpp
# Opt level: O0

void __thiscall
glcts::FramebufferNoAttachmentsBaseCase::expect_fbo_status
          (FramebufferNoAttachmentsBaseCase *this,GLenum target,GLenum expected_status,
          char *fail_message)

{
  int iVar1;
  deBool dVar2;
  GLenum GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ostream *poVar6;
  TestError *this_00;
  ostringstream local_330 [8];
  ostringstream msgStr_1;
  ostringstream local_1a8 [8];
  ostringstream msgStr;
  GLenum error;
  Functions *gl;
  char *fail_message_local;
  GLenum expected_status_local;
  GLenum target_local;
  FramebufferNoAttachmentsBaseCase *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  msgStr._372_4_ = (**(code **)(lVar5 + 0x800))();
  if (msgStr._372_4_ != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar6 = std::operator<<((ostream *)local_1a8,"Error before glCheckFramebufferStatus() for \'");
    poVar6 = std::operator<<(poVar6,fail_message);
    std::operator<<(poVar6,"\'\n");
    glu::checkError(msgStr._372_4_,"Error before glCheckFramebufferStatus()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cFramebufferNoAttachmentsTests.cpp"
                    ,0x7b);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  while ((dVar2 = ::deGetFalse(), dVar2 == 0 &&
         (GVar3 = (**(code **)(lVar5 + 0x170))(target), GVar3 == expected_status))) {
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      msgStr._372_4_ = (**(code **)(lVar5 + 0x800))();
      if (msgStr._372_4_ != 0) {
        std::__cxx11::ostringstream::ostringstream(local_330);
        poVar6 = std::operator<<((ostream *)local_330,
                                 "Error after glCheckFramebufferStatus() for \'");
        poVar6 = std::operator<<(poVar6,fail_message);
        std::operator<<(poVar6,"\'\n");
        glu::checkError(msgStr._372_4_,"Error after glCheckFramebufferStatus()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cFramebufferNoAttachmentsTests.cpp"
                        ,0x86);
        std::__cxx11::ostringstream::~ostringstream(local_330);
      }
      return;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,fail_message,"gl.checkFramebufferStatus(target) == expected_status",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cFramebufferNoAttachmentsTests.cpp"
             ,0x7e);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void FramebufferNoAttachmentsBaseCase::expect_fbo_status(GLenum target, GLenum expected_status,
														 const char* fail_message)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();
	GLenum				  error;

	error = gl.getError();
	if (error != GL_NO_ERROR)
	{
		std::ostringstream msgStr;
		msgStr << "Error before glCheckFramebufferStatus() for '" << fail_message << "'\n";

		GLU_EXPECT_NO_ERROR(error, "Error before glCheckFramebufferStatus()");
	}

	TCU_CHECK_MSG(gl.checkFramebufferStatus(target) == expected_status, fail_message);

	error = gl.getError();
	if (error != GL_NO_ERROR)
	{
		std::ostringstream msgStr;
		msgStr << "Error after glCheckFramebufferStatus() for '" << fail_message << "'\n";

		GLU_EXPECT_NO_ERROR(error, "Error after glCheckFramebufferStatus()");
	}
}